

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O1

MatrixDynSize * __thiscall
iDynTree::MatrixDynSize::operator=(MatrixDynSize *this,MatrixView<const_double> *other)

{
  MatrixStorageOrdering MVar1;
  size_t sVar2;
  size_t sVar3;
  pointer peVar4;
  long lVar5;
  size_t sVar6;
  double *pdVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  
  sVar2 = other->m_rows;
  this->m_rows = sVar2;
  sVar3 = other->m_cols;
  this->m_cols = sVar3;
  uVar11 = sVar3 * sVar2;
  if (uVar11 != 0) {
    if (this->m_capacity < uVar11) {
      if ((this->m_capacity != 0) && (this->m_data != (double *)0x0)) {
        operator_delete__(this->m_data);
      }
      pdVar7 = (double *)operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | uVar11 * 8);
      this->m_data = pdVar7;
      this->m_capacity = uVar11;
    }
    sVar2 = this->m_rows;
    if (sVar2 != 0) {
      pdVar7 = this->m_data;
      sVar3 = this->m_cols;
      sVar8 = 0;
      do {
        if (sVar3 != 0) {
          peVar4 = other->m_storage;
          MVar1 = other->m_storageOrder;
          lVar5 = other->m_outerStride;
          sVar9 = 0;
          do {
            sVar10 = sVar8;
            sVar6 = sVar9;
            if (MVar1 == RowMajor) {
              sVar10 = sVar9;
              sVar6 = sVar8;
            }
            pdVar7[sVar9] = peVar4[sVar6 * lVar5 + sVar10];
            sVar9 = sVar9 + 1;
          } while (sVar3 != sVar9);
        }
        sVar8 = sVar8 + 1;
        pdVar7 = pdVar7 + sVar3;
      } while (sVar8 != sVar2);
    }
  }
  return this;
}

Assistant:

MatrixDynSize& MatrixDynSize::operator=(MatrixView<const double> other)
{
    m_rows = other.rows();
    m_cols = other.cols();

    const std::size_t requiredCapacity = m_rows * m_cols;

    // if other is empty, return
    if (requiredCapacity == 0) return  *this;

    // If the copied data fits in the currently allocated buffer,
    // use that one (if the user want to free the memory can use
    // the shrink_to_fit method).
    // Otherwise, allocate a new buffer after deleting the old one)
    if (m_capacity < requiredCapacity) {
        // need to allocate new buffer
        // if old buffer exists, delete it
        if (m_capacity > 0) {
            delete [] m_data;
        }
        m_data = new double[requiredCapacity];
        m_capacity = requiredCapacity;
    }

    for(std::size_t i = 0; i < m_rows; i++)
    {
        for(std::size_t j = 0; j < m_cols; j++)
        {
            this->m_data[this->rawIndexRowMajor(i,j)] = other(i, j);
        }
    }

    return *this;
}